

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__h_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  int iVar1;
  uint local_38;
  uint local_34;
  uint total;
  int i;
  int j;
  int safe_w;
  uchar buffer [8];
  uint kernel_width_local;
  int stride_in_bytes_local;
  int h_local;
  int w_local;
  uchar *pixels_local;
  
  iVar1 = w - kernel_width;
  buffer._0_4_ = kernel_width;
  buffer._4_4_ = stride_in_bytes;
  memset(&j,0,8);
  total = 0;
  _h_local = pixels;
  do {
    if (h <= (int)total) {
      return;
    }
    memset(&j,0,(ulong)(uint)buffer._0_4_);
    local_38 = 0;
    switch(buffer._0_4_) {
    case 2:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)local_34] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (ulong)(local_34 + buffer._0_4_ & 7)) = _h_local[(int)local_34];
        _h_local[(int)local_34] = (uchar)(local_38 >> 1);
      }
      break;
    case 3:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)local_34] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (ulong)(local_34 + buffer._0_4_ & 7)) = _h_local[(int)local_34];
        _h_local[(int)local_34] = (uchar)((ulong)local_38 / 3);
      }
      break;
    case 4:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)local_34] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (ulong)(local_34 + buffer._0_4_ & 7)) = _h_local[(int)local_34];
        _h_local[(int)local_34] = (uchar)(local_38 >> 2);
      }
      break;
    case 5:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)local_34] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (ulong)(local_34 + buffer._0_4_ & 7)) = _h_local[(int)local_34];
        _h_local[(int)local_34] = (uchar)((ulong)local_38 / 5);
      }
      break;
    default:
      for (local_34 = 0; (int)local_34 <= iVar1; local_34 = local_34 + 1) {
        local_38 = ((uint)_h_local[(int)local_34] -
                   (uint)*(byte *)((long)&j + (long)(int)(local_34 & 7))) + local_38;
        *(uchar *)((long)&j + (ulong)(local_34 + buffer._0_4_ & 7)) = _h_local[(int)local_34];
        _h_local[(int)local_34] = (uchar)(local_38 / (uint)buffer._0_4_);
      }
    }
    for (; (int)local_34 < w; local_34 = local_34 + 1) {
      if (_h_local[(int)local_34] != '\0') {
        __assert_fail("pixels[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                      ,0xf41,"void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                     );
      }
      local_38 = local_38 - *(byte *)((long)&j + (long)(int)(local_34 & 7));
      _h_local[(int)local_34] = (uchar)(local_38 / (uint)buffer._0_4_);
    }
    _h_local = _h_local + (int)buffer._4_4_;
    total = total + 1;
  } while( true );
}

Assistant:

static void stbtt__h_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
   unsigned char buffer[STBTT_MAX_OVERSAMPLE];
   int safe_w = w - kernel_width;
   int j;
   STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); // suppress bogus warning from VS2013 -analyze
   for (j=0; j < h; ++j) {
      int i;
      unsigned int total;
      STBTT_memset(buffer, 0, kernel_width);

      total = 0;

      // make kernel_width a constant in common cases so compiler can optimize out the divide
      switch (kernel_width) {
         case 2:
            for (i=0; i <= safe_w; ++i) {
               total += pixels[i] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
               pixels[i] = (unsigned char) (total / 2);
            }
            break;
         case 3:
            for (i=0; i <= safe_w; ++i) {
               total += pixels[i] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
               pixels[i] = (unsigned char) (total / 3);
            }
            break;
         case 4:
            for (i=0; i <= safe_w; ++i) {
               total += pixels[i] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
               pixels[i] = (unsigned char) (total / 4);
            }
            break;
         case 5:
            for (i=0; i <= safe_w; ++i) {
               total += pixels[i] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
               pixels[i] = (unsigned char) (total / 5);
            }
            break;
         default:
            for (i=0; i <= safe_w; ++i) {
               total += pixels[i] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i];
               pixels[i] = (unsigned char) (total / kernel_width);
            }
            break;
      }

      for (; i < w; ++i) {
         STBTT_assert(pixels[i] == 0);
         total -= buffer[i & STBTT__OVER_MASK];
         pixels[i] = (unsigned char) (total / kernel_width);
      }

      pixels += stride_in_bytes;
   }
}